

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImageDataOperations.h
# Opt level: O3

void fe::operations::
     applyOperationT<fe::operations::op_blend_one_invSrcAlpha,fe::PixelA8,fe::PixelR8G8B8A8>
               (op_blend_one_invSrcAlpha *op,PixelA8 *srcPixelFormat,PixelR8G8B8A8 *destPixelFormat,
               ImageData *src,ImageData *dest)

{
  int iVar1;
  int iVar2;
  bool bVar3;
  int x;
  int y;
  uint8_t *srcData;
  uint8_t *destData;
  uint8_t *local_60;
  uint8_t *local_58;
  
  bVar3 = check(src,dest);
  if ((bVar3) && (iVar1 = (dest->super_fe_image).h, iVar1 != 0)) {
    iVar2 = (dest->super_fe_image).w;
    local_58 = (dest->super_fe_image).data;
    local_60 = (src->super_fe_image).data;
    y = 0;
    do {
      if (iVar2 != 0) {
        x = 0;
        srcData = local_60;
        destData = local_58;
        do {
          op_blend_one_invSrcAlpha::operator()
                    (op,srcPixelFormat,destPixelFormat,srcData,destData,x,y);
          destData = destData + (dest->super_fe_image).bytespp;
          srcData = srcData + (src->super_fe_image).bytespp;
          x = x + 1;
        } while (iVar2 != x);
      }
      local_60 = local_60 + (src->super_fe_image).pitch;
      local_58 = local_58 + (dest->super_fe_image).pitch;
      y = y + 1;
    } while (y != iVar1);
  }
  return;
}

Assistant:

void applyOperationT(const Op& op, const Src& srcPixelFormat, Dest& destPixelFormat, const ImageData& src, const ImageData& dest)
        {
            if (!check(src, dest))
                return;

            const unsigned char* srcBuffer = (unsigned char*)src.data;
            unsigned char* destBuffer = (unsigned char*)dest.data;

            int w = dest.w;
            int h = dest.h;

            for (int y = 0; y != h; ++y)
            {
                const unsigned char* srcLine = srcBuffer;
                unsigned char* destLine = destBuffer;

                for (int x = 0; x != w; ++x)
                {
                    op(srcPixelFormat, destPixelFormat, srcLine, destLine, x, y);

                    destLine += dest.bytespp;
                    srcLine += src.bytespp;
                }

                srcBuffer += src.pitch;
                destBuffer += dest.pitch;
            }
        }